

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O2

void __thiscall
spdlog::details::v_formatter<spdlog::details::scoped_padder>::format
          (v_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  memory_buf_t *dest_00;
  string_view_t view;
  scoped_padder p;
  scoped_padder sStack_38;
  
  dest_00 = dest;
  scoped_padder::scoped_padder
            (&sStack_38,(msg->payload).size_,&(this->super_flag_formatter).padinfo_,dest);
  view.size_ = (size_t)dest;
  view.data_ = (char *)(msg->payload).size_;
  fmt_helper::append_string_view((fmt_helper *)(msg->payload).data_,view,dest_00);
  scoped_padder::~scoped_padder(&sStack_38);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        ScopedPadder p(msg.payload.size(), padinfo_, dest);
        fmt_helper::append_string_view(msg.payload, dest);
    }